

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O2

void __thiscall ui::AboutImpl::~AboutImpl(AboutImpl *this)

{
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__AboutImpl_00167650;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->viewLogo).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->button_text);
  std::__cxx11::string::~string((string *)&this->title_);
  ftxui::ComponentBase::~ComponentBase((ComponentBase *)this);
  return;
}

Assistant:

std::string Title() override { return "About"; }